

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::
FunctionMocker<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
PerformDefaultAction
          (FunctionMocker<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
           *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_00;
  Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_01;
  Result pEVar1;
  string message;
  _Head_base<0UL,_const_ot::commissioner::Address_&,_false> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 ==
      (OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *)0x0)
  {
    std::operator+(&local_30,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    pEVar1 = DefaultValue<const_ot::commissioner::EnergyReport_*>::Get();
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    this_01 = OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
              ::GetAction(this_00);
    local_38._M_head_impl =
         (args->super__Tuple_impl<0UL,_const_ot::commissioner::Address_&>).
         super__Head_base<0UL,_const_ot::commissioner::Address_&,_false>._M_head_impl;
    pEVar1 = Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
             Perform(this_01,(ArgumentTuple *)&local_38);
  }
  return pEVar1;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }